

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_fp_denorm(Impl *this)

{
  int iVar1;
  Function *this_00;
  Builder *pBVar2;
  Function *entryPoint;
  ExecutionMode mode;
  Attribute attr;
  String str;
  Capability local_44;
  Attribute local_40;
  String local_38;
  
  this_00 = get_entry_point_function(this->entry_point_meta);
  if (this_00 == (Function *)0x0) {
    return true;
  }
  local_40 = LLVMBC::Function::getFnAttribute(this_00,"fp32-denorm-mode");
  LLVMBC::Attribute::getValueAsString_abi_cxx11_(&local_38,&local_40);
  iVar1 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::compare
                    (&local_38,"ftz");
  if (iVar1 == 0) {
    pBVar2 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addExtension(pBVar2,"SPV_KHR_float_controls");
    pBVar2 = SPIRVModule::get_builder(this->spirv_module);
    local_44 = CapabilityDenormFlushToZero;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar2->capabilities,&local_44);
    mode = ExecutionModeDenormFlushToZero;
  }
  else {
    iVar1 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            compare(&local_38,"preserve");
    if (iVar1 != 0) goto LAB_00123f6e;
    pBVar2 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addExtension(pBVar2,"SPV_KHR_float_controls");
    pBVar2 = SPIRVModule::get_builder(this->spirv_module);
    local_44 = CapabilityDenormPreserve;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar2->capabilities,&local_44);
    mode = ExecutionModeDenormPreserve;
  }
  pBVar2 = SPIRVModule::get_builder(this->spirv_module);
  entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
  spv::Builder::addExecutionMode(pBVar2,entryPoint,mode,0x20,-1,-1);
LAB_00123f6e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    free_in_thread(local_38._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_fp_denorm()
{
	// Check for SM 6.2 denorm handling. Only applies to FP32.
	auto *func = get_entry_point_function(entry_point_meta);
	if (!func)
		return true;

	auto attr = func->getFnAttribute("fp32-denorm-mode");
	auto str = attr.getValueAsString();
	if (str == "ftz")
	{
		builder().addExtension("SPV_KHR_float_controls");
		builder().addCapability(spv::CapabilityDenormFlushToZero);
		builder().addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormFlushToZero, 32);
	}
	else if (str == "preserve")
	{
		builder().addExtension("SPV_KHR_float_controls");
		builder().addCapability(spv::CapabilityDenormPreserve);
		builder().addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormPreserve, 32);
	}

	return true;
}